

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdrTsim3.c
# Opt level: O0

void Txs3_ManCollectCone(Txs3_Man_t *p,int fVerbose)

{
  Gia_Man_t *pGVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  Gia_Obj_t *pGVar6;
  int *piVar7;
  bool bVar8;
  int local_24;
  int Entry;
  int i;
  Gia_Obj_t *pObj;
  int fVerbose_local;
  Txs3_Man_t *p_local;
  
  Vec_IntClear(p->vCiObjs);
  Vec_IntClear(p->vFosPre);
  Vec_IntClear(p->vFosAbs);
  Vec_IntClear(p->vNodes);
  pGVar6 = Gia_ManConst0(p->pGia);
  pGVar6->Value = 0xffffffff;
  local_24 = 0;
  while( true ) {
    iVar2 = Vec_IntSize(p->vCoObjs);
    bVar8 = false;
    if (local_24 < iVar2) {
      pGVar1 = p->pGia;
      iVar2 = Vec_IntEntry(p->vCoObjs,local_24);
      _Entry = Gia_ManObj(pGVar1,iVar2);
      bVar8 = _Entry != (Gia_Obj_t *)0x0;
    }
    if (!bVar8) break;
    pGVar6 = Gia_ObjFanin0(_Entry);
    Txs3_ManCollectCone_rec(p,pGVar6);
    local_24 = local_24 + 1;
  }
  if (fVerbose != 0) {
    uVar3 = Vec_IntSize(p->vCiObjs);
    uVar4 = Vec_IntSize(p->vFosPre);
    uVar5 = Vec_IntSize(p->vFosAbs);
    printf("%d %d %d \n",(ulong)uVar3,(ulong)uVar4,(ulong)uVar5);
  }
  iVar2 = Vec_IntSize(p->vCiObjs);
  p->nPiLits = iVar2;
  piVar7 = Vec_IntArray(p->vCiObjs);
  iVar2 = Vec_IntSize(p->vCiObjs);
  Vec_IntSelectSort(piVar7,iVar2);
  piVar7 = Vec_IntArray(p->vFosPre);
  iVar2 = Vec_IntSize(p->vFosPre);
  Vec_IntSelectSortReverse(piVar7,iVar2);
  for (local_24 = 0; iVar2 = Vec_IntSize(p->vFosPre), local_24 < iVar2; local_24 = local_24 + 1) {
    iVar2 = Vec_IntEntry(p->vFosPre,local_24);
    Vec_IntPush(p->vCiObjs,iVar2);
  }
  piVar7 = Vec_IntArray(p->vFosAbs);
  iVar2 = Vec_IntSize(p->vFosAbs);
  Vec_IntSelectSortReverse(piVar7,iVar2);
  for (local_24 = 0; iVar2 = Vec_IntSize(p->vFosAbs), local_24 < iVar2; local_24 = local_24 + 1) {
    iVar2 = Vec_IntEntry(p->vFosAbs,local_24);
    Vec_IntPush(p->vCiObjs,iVar2);
  }
  local_24 = 0;
  while( true ) {
    iVar2 = Vec_IntSize(p->vCiObjs);
    bVar8 = false;
    if (local_24 < iVar2) {
      pGVar1 = p->pGia;
      iVar2 = Vec_IntEntry(p->vCiObjs,local_24);
      _Entry = Gia_ManObj(pGVar1,iVar2);
      bVar8 = _Entry != (Gia_Obj_t *)0x0;
    }
    if (!bVar8) break;
    _Entry->Value = 0;
    local_24 = local_24 + 1;
  }
  local_24 = 0;
  while( true ) {
    iVar2 = Vec_IntSize(p->vNodes);
    bVar8 = false;
    if (local_24 < iVar2) {
      pGVar1 = p->pGia;
      iVar2 = Vec_IntEntry(p->vNodes,local_24);
      _Entry = Gia_ManObj(pGVar1,iVar2);
      bVar8 = _Entry != (Gia_Obj_t *)0x0;
    }
    if (!bVar8) break;
    _Entry->Value = 0;
    local_24 = local_24 + 1;
  }
  return;
}

Assistant:

void Txs3_ManCollectCone( Txs3_Man_t * p, int fVerbose )
{
    Gia_Obj_t * pObj; int i, Entry;
//    printf( "Collecting cones for clause with %d literals.\n", Vec_IntSize(vCoObjs) );
    Vec_IntClear( p->vCiObjs );
    Vec_IntClear( p->vFosPre );
    Vec_IntClear( p->vFosAbs );
    Vec_IntClear( p->vNodes );
    Gia_ManConst0(p->pGia)->Value = ~0;
    Gia_ManForEachObjVec( p->vCoObjs, p->pGia, pObj, i )
        Txs3_ManCollectCone_rec( p, Gia_ObjFanin0(pObj) );
if ( fVerbose )
printf( "%d %d %d \n", Vec_IntSize(p->vCiObjs), Vec_IntSize(p->vFosPre), Vec_IntSize(p->vFosAbs) );
    p->nPiLits = Vec_IntSize(p->vCiObjs);
    // sort primary inputs
    Vec_IntSelectSort( Vec_IntArray(p->vCiObjs), Vec_IntSize(p->vCiObjs) );
    // sort and add present flop variables
    Vec_IntSelectSortReverse( Vec_IntArray(p->vFosPre), Vec_IntSize(p->vFosPre) );
    Vec_IntForEachEntry( p->vFosPre, Entry, i )
        Vec_IntPush( p->vCiObjs, Entry );
    // sort and add absent flop variables
    Vec_IntSelectSortReverse( Vec_IntArray(p->vFosAbs), Vec_IntSize(p->vFosAbs) );
    Vec_IntForEachEntry( p->vFosAbs, Entry, i )
        Vec_IntPush( p->vCiObjs, Entry );
    // cleanup
    Gia_ManForEachObjVec( p->vCiObjs, p->pGia, pObj, i )
        pObj->Value = 0;
    Gia_ManForEachObjVec( p->vNodes, p->pGia, pObj, i )
        pObj->Value = 0;
}